

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int calc_cookie_signature
              (ptls_t *tls,ptls_handshake_properties_t *properties,
              ptls_key_exchange_algorithm_t *negotiated_group,ptls_iovec_t tbs,uint8_t *sig)

{
  ushort uVar1;
  ptls_hash_algorithm_t *algo;
  ulong uVar2;
  uint8_t *puVar3;
  ptls_hash_context_t *ppVar4;
  size_t sVar5;
  int iVar6;
  uint8_t len8_3;
  uint8_t len8_2;
  uint8_t len8_1;
  uint8_t len8;
  uint8_t b_1 [2];
  uint8_t b [2];
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  ushort local_44;
  ushort local_42;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_38 = tbs.base;
  algo = (*tls->ctx->cipher_suites)->hash;
  ppVar4 = ptls_hmac_create(algo,(properties->field_0).server.cookie.key,algo->digest_size);
  if (ppVar4 == (ptls_hash_context_t *)0x0) {
    iVar6 = 0x201;
  }
  else {
    local_45 = 0x20;
    local_40 = sig;
    (*ppVar4->update)(ppVar4,&local_45,1);
    (*ppVar4->update)(ppVar4,tls->client_random,0x20);
    if (tls->server_name == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = strlen(tls->server_name);
      if (0xfe < sVar5) {
        __assert_fail("len < UINT8_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                      ,0xe01,
                      "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                     );
      }
    }
    local_46 = (undefined1)sVar5;
    (*ppVar4->update)(ppVar4,&local_46,1);
    (*ppVar4->update)(ppVar4,tls->server_name,sVar5);
    uVar1 = tls->cipher_suite->id;
    local_42 = uVar1 << 8 | uVar1 >> 8;
    (*ppVar4->update)(ppVar4,&local_42,2);
    local_44 = negotiated_group->id << 8 | negotiated_group->id >> 8;
    (*ppVar4->update)(ppVar4,&local_44,2);
    uVar2 = (properties->field_0).server.cookie.additional_data.len;
    if (0xfe < uVar2) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                    ,0xe04,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_47 = (undefined1)uVar2;
    (*ppVar4->update)(ppVar4,&local_47,1);
    (*ppVar4->update)(ppVar4,(properties->field_0).server.cookie.additional_data.base,uVar2);
    puVar3 = local_40;
    if (0xfe < tbs.len) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                    ,0xe06,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_48 = (undefined1)tbs.len;
    (*ppVar4->update)(ppVar4,&local_48,1);
    (*ppVar4->update)(ppVar4,local_38,tbs.len);
    iVar6 = 0;
    (*ppVar4->final)(ppVar4,puVar3,PTLS_HASH_FINAL_MODE_FREE);
  }
  return iVar6;
}

Assistant:

static int calc_cookie_signature(ptls_t *tls, ptls_handshake_properties_t *properties,
                                 ptls_key_exchange_algorithm_t *negotiated_group, ptls_iovec_t tbs, uint8_t *sig)
{
    ptls_hash_algorithm_t *algo = tls->ctx->cipher_suites[0]->hash;
    ptls_hash_context_t *hctx;

    if ((hctx = ptls_hmac_create(algo, properties->server.cookie.key, algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

#define UPDATE_BLOCK(p, _len)                                                                                                      \
    do {                                                                                                                           \
        size_t len = (_len);                                                                                                       \
        assert(len < UINT8_MAX);                                                                                                   \
        uint8_t len8 = (uint8_t)len;                                                                                               \
        hctx->update(hctx, &len8, 1);                                                                                              \
        hctx->update(hctx, (p), len);                                                                                              \
    } while (0)
#define UPDATE16(_v)                                                                                                               \
    do {                                                                                                                           \
        uint16_t v = (_v);                                                                                                         \
        uint8_t b[2] = {v >> 8, v & 0xff};                                                                                         \
        hctx->update(hctx, b, 2);                                                                                                  \
    } while (0)

    UPDATE_BLOCK(tls->client_random, sizeof(tls->client_random));
    UPDATE_BLOCK(tls->server_name, tls->server_name != NULL ? strlen(tls->server_name) : 0);
    UPDATE16(tls->cipher_suite->id);
    UPDATE16(negotiated_group->id);
    UPDATE_BLOCK(properties->server.cookie.additional_data.base, properties->server.cookie.additional_data.len);

    UPDATE_BLOCK(tbs.base, tbs.len);

#undef UPDATE_BLOCK
#undef UPDATE16

    hctx->final(hctx, sig, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}